

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

uchar * cppcms::b64url::encode(uchar *begin,uchar *end,uchar *target)

{
  uchar *puVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  for (uVar2 = (long)end - (long)begin; 2 < (long)uVar2; uVar2 = uVar2 - 3) {
    *target = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[*begin >> 2];
    target[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                [(uint)(begin[1] >> 4) | (*begin & 3) << 4];
    target[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                [(uint)(begin[2] >> 6) + (begin[1] & 0xf) * 4];
    target[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[begin[2] & 0x3f];
    begin = begin + 3;
    target = target + 4;
  }
  if (begin != end) {
    *target = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[*begin >> 2];
    uVar4 = (*begin & 3) << 4;
    if (uVar2 < 2) {
      puVar1 = (uchar *)("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_" + uVar4)
      ;
      lVar3 = 2;
      lVar5 = 1;
    }
    else {
      target[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                  [(byte)((byte)uVar4 | begin[1] >> 4)];
      uVar4 = (begin[1] & 0xf) << 2;
      if (uVar2 == 2) {
        puVar1 = (uchar *)("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_" +
                          uVar4);
        lVar3 = 3;
        lVar5 = 2;
      }
      else {
        target[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                    [(byte)((byte)uVar4 | begin[2] >> 6)];
        puVar1 = (uchar *)("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_" +
                          (begin[2] & 0x3f));
        lVar3 = 4;
        lVar5 = 3;
      }
    }
    target[lVar5] = *puVar1;
    target = target + lVar3;
  }
  return target;
}

Assistant:

unsigned char *encode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=3) {
		bencode(begin,target,3);
		begin += 3;
		target += 4;
	}
	if(end!=begin)
		target+=bencode(begin,target,end-begin);
	return target;
}